

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall
tetgenmesh::gettetrahedron(tetgenmesh *this,point pa,point pb,point pc,point pd,triface *searchtet)

{
  tetrahedron *pppdVar1;
  uint uVar2;
  tetrahedron ppdVar3;
  int iVar4;
  uint uVar5;
  tetrahedron *pppdVar6;
  int *piVar7;
  
  iVar4 = getedge(this,pa,pb,searchtet);
  if (iVar4 != 0) {
    piVar7 = &searchtet->ver;
    pppdVar6 = searchtet->tet;
    do {
      iVar4 = *piVar7;
      if (pppdVar6[apexpivot[iVar4]] == (tetrahedron)pc) {
        searchtet->tet = pppdVar6;
        searchtet->ver = iVar4;
        break;
      }
      pppdVar1 = pppdVar6 + facepivot1[iVar4];
      pppdVar6 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
      piVar7 = facepivot2[iVar4] + ((uint)*pppdVar1 & 0xf);
    } while (searchtet->tet != pppdVar6);
    pppdVar6 = searchtet->tet;
    uVar2 = searchtet->ver;
    if (pppdVar6[apexpivot[(int)uVar2]] == (tetrahedron)pc) {
      if (pppdVar6[oppopivot[(int)uVar2]] == (tetrahedron)pd) {
        return 1;
      }
      ppdVar3 = pppdVar6[uVar2 & 3];
      uVar5 = (uint)ppdVar3 & 0xf;
      searchtet->ver = uVar5;
      pppdVar6 = (tetrahedron *)((ulong)ppdVar3 & 0xfffffffffffffff0);
      searchtet->tet = pppdVar6;
      iVar4 = fsymtbl[(int)uVar2][uVar5];
      searchtet->ver = iVar4;
      if (pppdVar6[oppopivot[iVar4]] == (tetrahedron)pd) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int tetgenmesh::gettetrahedron(point pa, point pb, point pc, point pd, 
                               triface *searchtet)
{
  triface spintet;
  int t1ver; 

  if (getedge(pa, pb, searchtet)) {
    spintet = *searchtet;
    while (1) {
      if (apex(spintet) == pc) {
        *searchtet = spintet;
        break;
      }
      fnextself(spintet);
      if (spintet.tet == searchtet->tet) break;
    }
    if (apex(*searchtet) == pc) {
      if (oppo(*searchtet) == pd) {
        return 1;
      } else {
        fsymself(*searchtet);
        if (oppo(*searchtet) == pd) {
          return 1;
        }
      }
    }
  }

  return 0;
}